

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

CURLcode file_connect(Curl_easy *data,_Bool *done)

{
  FILEPROTO *pFVar1;
  char *__file;
  CURLcode CVar2;
  int iVar3;
  void *pvVar4;
  size_t real_path_len;
  char *local_38;
  size_t local_30;
  
  pFVar1 = (data->req).p.file;
  if (pFVar1->path == (char *)0x0) {
    CVar2 = Curl_urldecode((data->state).up.path,0,&local_38,&local_30,REJECT_ZERO);
    __file = local_38;
    if (CVar2 == CURLE_OK) {
      pvVar4 = memchr(local_38,0,local_30);
      if (pvVar4 == (void *)0x0) {
        CVar2 = CURLE_OK;
        iVar3 = open64(__file,0);
        pFVar1->path = local_38;
        (*Curl_cfree)(pFVar1->freepath);
        pFVar1->freepath = local_38;
        pFVar1->fd = iVar3;
        if ((iVar3 == -1) && ((*(uint *)&(data->state).field_0x774 & 0x20000) == 0)) {
          CVar2 = 0x173d47;
          Curl_failf(data,"Couldn\'t open file %s",(data->state).up.path);
          file_done(data,CVar2,false);
          CVar2 = CURLE_FILE_COULDNT_READ_FILE;
        }
        else {
          *done = true;
        }
      }
      else {
        (*Curl_cfree)(__file);
        CVar2 = CURLE_URL_MALFORMAT;
      }
    }
  }
  else {
    *done = true;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode file_connect(struct Curl_easy *data, bool *done)
{
  char *real_path;
  struct FILEPROTO *file = data->req.p.file;
  int fd;
#ifdef DOS_FILESYSTEM
  size_t i;
  char *actual_path;
#endif
  size_t real_path_len;
  CURLcode result;

  if(file->path) {
    /* already connected.
     * the handler->connect_it() is normally only called once, but
     * FILE does a special check on setting up the connection which
     * calls this explicitly. */
    *done = TRUE;
    return CURLE_OK;
  }

  result = Curl_urldecode(data->state.up.path, 0, &real_path,
                          &real_path_len, REJECT_ZERO);
  if(result)
    return result;

#ifdef DOS_FILESYSTEM
  /* If the first character is a slash, and there is
     something that looks like a drive at the beginning of
     the path, skip the slash. If we remove the initial
     slash in all cases, paths without drive letters end up
     relative to the current directory which is not how
     browsers work.

     Some browsers accept | instead of : as the drive letter
     separator, so we do too.

     On other platforms, we need the slash to indicate an
     absolute pathname. On Windows, absolute paths start
     with a drive letter.
  */
  actual_path = real_path;
  if((actual_path[0] == '/') &&
      actual_path[1] &&
     (actual_path[2] == ':' || actual_path[2] == '|')) {
    actual_path[2] = ':';
    actual_path++;
    real_path_len--;
  }

  /* change path separators from '/' to '\\' for DOS, Windows and OS/2 */
  for(i = 0; i < real_path_len; ++i)
    if(actual_path[i] == '/')
      actual_path[i] = '\\';
    else if(!actual_path[i]) { /* binary zero */
      Curl_safefree(real_path);
      return CURLE_URL_MALFORMAT;
    }

  fd = open_readonly(actual_path, O_RDONLY|O_BINARY);
  file->path = actual_path;
#else
  if(memchr(real_path, 0, real_path_len)) {
    /* binary zeroes indicate foul play */
    Curl_safefree(real_path);
    return CURLE_URL_MALFORMAT;
  }

  #ifdef AMIGA_FILESYSTEM
  /*
   * A leading slash in an AmigaDOS path denotes the parent
   * directory, and hence we block this as it is relative.
   * Absolute paths start with 'volumename:', so we check for
   * this first. Failing that, we treat the path as a real Unix
   * path, but only if the application was compiled with -lunix.
   */
  fd = -1;
  file->path = real_path;

  if(real_path[0] == '/') {
    extern int __unix_path_semantics;
    if(strchr(real_path + 1, ':')) {
      /* Amiga absolute path */
      fd = open_readonly(real_path + 1, O_RDONLY);
      file->path++;
    }
    else if(__unix_path_semantics) {
      /* -lunix fallback */
      fd = open_readonly(real_path, O_RDONLY);
    }
  }
  #else
  fd = open_readonly(real_path, O_RDONLY);
  file->path = real_path;
  #endif
#endif
  Curl_safefree(file->freepath);
  file->freepath = real_path; /* free this when done */

  file->fd = fd;
  if(!data->state.upload && (fd == -1)) {
    failf(data, "Couldn't open file %s", data->state.up.path);
    file_done(data, CURLE_FILE_COULDNT_READ_FILE, FALSE);
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  *done = TRUE;

  return CURLE_OK;
}